

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O0

int __thiscall
glcts::SampleShadingRenderFormatTests::init(SampleShadingRenderFormatTests *this,EVP_PKEY_CTX *ctx)

{
  GLfloat GVar1;
  GLfloat GVar2;
  GLSLVersion GVar3;
  GLenum GVar4;
  Context *pCVar5;
  int extraout_EAX;
  SampleShadingRenderCase *pSVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  SampleShadingRenderFormatTests *this_local;
  
  pSVar6 = (SampleShadingRenderCase *)operator_new(0x108);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  GVar3 = this->m_glslVersion;
  GVar4 = this->m_internalFormat;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  GVar1 = this->m_min;
  GVar2 = this->m_max;
  pcVar9 = (char *)std::__cxx11::string::c_str();
  SampleShadingRenderCase::SampleShadingRenderCase
            (pSVar6,pCVar5,"full","Sample shader functionality",GVar3,GVar4,&this->m_texFormat,
             pcVar7,pcVar8,GVar1,GVar2,pcVar9,1.0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar6);
  pSVar6 = (SampleShadingRenderCase *)operator_new(0x108);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  GVar3 = this->m_glslVersion;
  GVar4 = this->m_internalFormat;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  GVar1 = this->m_min;
  GVar2 = this->m_max;
  pcVar9 = (char *)std::__cxx11::string::c_str();
  SampleShadingRenderCase::SampleShadingRenderCase
            (pSVar6,pCVar5,"half","Sample shader functionality",GVar3,GVar4,&this->m_texFormat,
             pcVar7,pcVar8,GVar1,GVar2,pcVar9,0.5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar6);
  pSVar6 = (SampleShadingRenderCase *)operator_new(0x108);
  pCVar5 = (this->super_TestCaseGroup).m_context;
  GVar3 = this->m_glslVersion;
  GVar4 = this->m_internalFormat;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  GVar1 = this->m_min;
  GVar2 = this->m_max;
  pcVar9 = (char *)std::__cxx11::string::c_str();
  SampleShadingRenderCase::SampleShadingRenderCase
            (pSVar6,pCVar5,"none","Sample shader functionality",GVar3,GVar4,&this->m_texFormat,
             pcVar7,pcVar8,GVar1,GVar2,pcVar9,0.0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar6);
  return extraout_EAX;
}

Assistant:

void SampleShadingRenderFormatTests::init(void)
{
	// sample_shading.render.full
	addChild(new SampleShadingRenderCase(m_context, "full", "Sample shader functionality", m_glslVersion,
										 m_internalFormat, m_texFormat, m_sampler.c_str(), m_outType.c_str(), m_min,
										 m_max, m_extension.c_str(), 1.0));
	// sample_shading.render.half
	addChild(new SampleShadingRenderCase(m_context, "half", "Sample shader functionality", m_glslVersion,
										 m_internalFormat, m_texFormat, m_sampler.c_str(), m_outType.c_str(), m_min,
										 m_max, m_extension.c_str(), 0.5));
	// sample_shading.render.none
	addChild(new SampleShadingRenderCase(m_context, "none", "Sample shader functionality", m_glslVersion,
										 m_internalFormat, m_texFormat, m_sampler.c_str(), m_outType.c_str(), m_min,
										 m_max, m_extension.c_str(), 0.0));
}